

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

void add(sha256_ctx *ctx,void *p,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  
  uVar1 = (ulong)((uint)ctx->bytes & 0x3f);
  if (0x3f < len + uVar1) {
    __n = 0x40 - uVar1;
    memcpy((void *)((long)ctx->s + uVar1 + 0x20),p,__n);
    ctx->bytes = ctx->bytes + __n;
    p = (void *)((long)p + __n);
    len = len - __n;
    Transform(ctx->s,(ctx->buf).u32,1);
    uVar1 = 0;
  }
  if (0x3f < len) {
    uVar2 = len & 0xffffffffffffffc0;
    Transform(ctx->s,(uint32_t *)p,len >> 6);
    ctx->bytes = ctx->bytes + uVar2;
    len = (size_t)((uint)len & 0x3f);
    p = (void *)((long)p + uVar2);
  }
  if (len != 0) {
    memcpy((void *)((long)ctx->s + uVar1 + 0x20),p,len);
    ctx->bytes = ctx->bytes + len;
  }
  return;
}

Assistant:

static void add(struct sha512_ctx *ctx, const void *p, size_t len)
{
	const unsigned char *data = p;
	size_t bufsize = ctx->bytes % 128;

	if (bufsize + len >= 128) {
		/* Fill the buffer, and process it. */
		memcpy(ctx->buf.u8 + bufsize, data, 128 - bufsize);
		ctx->bytes += 128 - bufsize;
		data += 128 - bufsize;
		len -= 128 - bufsize;
		Transform(ctx->s, ctx->buf.u64);
		bufsize = 0;
	}

	while (len >= 128) {
		/* Process full chunks directly from the source. */
		if (alignment_ok(data, sizeof(uint64_t)))
			Transform(ctx->s, (const uint64_t *)data);
		else {
			memcpy(ctx->buf.u8, data, sizeof(ctx->buf));
			Transform(ctx->s, ctx->buf.u64);
		}
		ctx->bytes += 128;
		data += 128;
		len -= 128;
	}

	if (len) {
		/* Fill the buffer with what remains. */
		memcpy(ctx->buf.u8 + bufsize, data, len);
		ctx->bytes += len;
	}
}